

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2projections.cc
# Opt level: O1

R2Point __thiscall S2::Projection::WrapDestination(Projection *this,R2Point *a,R2Point *b)

{
  double dVar1;
  double __y;
  double dVar2;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  R2Point RVar5;
  
  (*this->_vptr_Projection[7])();
  dVar3 = b->c_[0];
  dVar4 = b->c_[1];
  if (0.0 < __y) {
    dVar1 = a->c_[0];
    dVar2 = dVar3 - dVar1;
    if (__y * 0.5 < ABS(dVar2)) {
      dVar3 = remainder(dVar2,__y);
      dVar3 = dVar1 + dVar3;
    }
  }
  if (0.0 < in_XMM1_Qa) {
    dVar1 = a->c_[1];
    dVar2 = dVar4 - dVar1;
    if (in_XMM1_Qa * 0.5 < ABS(dVar2)) {
      dVar4 = remainder(dVar2,in_XMM1_Qa);
      dVar4 = dVar1 + dVar4;
    }
  }
  RVar5.c_[1] = dVar4;
  RVar5.c_[0] = dVar3;
  return (R2Point)RVar5.c_;
}

Assistant:

R2Point Projection::WrapDestination(const R2Point& a, const R2Point& b) const {
  R2Point wrap = wrap_distance();
  double x = b.x(), y = b.y();
  // The code below ensures that "b" is unmodified unless wrapping is required.
  if (wrap.x() > 0 && fabs(x - a.x()) > 0.5 * wrap.x()) {
    x = a.x() + remainder(x - a.x(), wrap.x());
  }
  if (wrap.y() > 0 && fabs(y - a.y()) > 0.5 * wrap.y()) {
    y = a.y() + remainder(y - a.y(), wrap.y());
  }
  return R2Point(x, y);
}